

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_abstract_transaction.cpp
# Opt level: O1

void __thiscall
AbstractTransaction_GetValueOut_Test::TestBody(AbstractTransaction_GetValueOut_Test *this)

{
  _func_int **pp_Var1;
  scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
  sVar2;
  _Alloc_hider _Var3;
  bool bVar4;
  char *pcVar5;
  Amount AVar6;
  Txid txid;
  string hex;
  AssertionResult gtest_ar_4;
  ByteData256 bytedata;
  Transaction tx;
  ByteData bytedata2;
  undefined1 local_168 [32];
  undefined1 local_148 [16];
  undefined *local_138 [2];
  undefined1 local_128 [64];
  AssertHelper local_e8;
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  local_e0;
  AssertHelper local_d8;
  string local_d0;
  Amount local_b0;
  Transaction local_a0;
  ByteData local_60;
  ScriptWitness local_48;
  
  cfd::core::Transaction::Transaction(&local_a0,2,3);
  local_148._0_8_ = local_138;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)local_148,"e9f71e1f6787f47af671b62f4e29bda856ec3d51a817c62e1cea7f9f0c0190b6",
             "");
  cfd::core::Txid::Txid((Txid *)local_168,(string *)local_148);
  local_d0._M_dataplus._M_p = (pointer)&local_d0.field_2;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)&local_d0,"76a914100358d754597ca2f010f6d84f4a0fe74f71f7bb88ac","");
  cfd::core::Script::Script((Script *)local_128,&local_d0);
  cfd::core::Transaction::AddTxIn(&local_a0,(Txid *)local_168,0,0xffffffff,(Script *)local_128);
  cfd::core::Script::~Script((Script *)local_128);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_d0._M_dataplus._M_p != &local_d0.field_2) {
    operator_delete(local_d0._M_dataplus._M_p);
  }
  local_168._0_8_ = &PTR__Txid_0068dcd8;
  if ((pointer)local_168._8_8_ != (pointer)0x0) {
    operator_delete((void *)local_168._8_8_);
  }
  if ((undefined **)local_148._0_8_ != local_138) {
    operator_delete((void *)local_148._0_8_);
  }
  AVar6 = cfd::core::Amount::CreateBySatoshiAmount(10000);
  local_148._0_8_ = AVar6.amount_;
  local_148[8] = AVar6.ignore_check_;
  pp_Var1 = (_func_int **)(local_168 + 0x10);
  local_168._0_8_ = pp_Var1;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)local_168,"0014913e0b9281dab16f502101ad4e655074396f34c5","");
  cfd::core::Script::Script((Script *)local_128,(string *)local_168);
  cfd::core::Transaction::AddTxOut(&local_a0,(Amount *)local_148,(Script *)local_128);
  cfd::core::Script::~Script((Script *)local_128);
  if ((_func_int **)local_168._0_8_ != pp_Var1) {
    operator_delete((void *)local_168._0_8_);
  }
  cfd::core::Amount::Amount(&local_b0);
  bVar4 = testing::internal::AlwaysTrue();
  if (bVar4) {
    bVar4 = testing::internal::AlwaysTrue();
    if (bVar4) {
      AVar6 = cfd::core::AbstractTransaction::GetValueOut(&local_a0.super_AbstractTransaction);
      local_b0.amount_ = AVar6.amount_;
      local_b0.ignore_check_ = AVar6.ignore_check_;
    }
  }
  else {
    testing::Message::Message((Message *)local_128);
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)local_168,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/p2pderivatives[P]cfd/external/cfd-core/test/test_abstract_transaction.cpp"
               ,0x109,
               "Expected: amount = tx.GetValueOut() doesn\'t throw an exception.\n  Actual: it throws."
              );
    testing::internal::AssertHelper::operator=((AssertHelper *)local_168,(Message *)local_128);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)local_168);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_128._0_8_ !=
        (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)0x0) {
      bVar4 = testing::internal::IsTrue(true);
      if ((bVar4) &&
         ((basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)local_128._0_8_
          != (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0)) {
        (**(code **)(*(size_type *)local_128._0_8_ + 8))();
      }
      local_128._0_8_ =
           (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0;
    }
  }
  local_168._0_8_ = cfd::core::Amount::GetSatoshiValue(&local_b0);
  local_148._0_4_ = 10000;
  testing::internal::CmpHelperEQ<long,int>
            ((internal *)local_128,"amount.GetSatoshiValue()","10000",(long *)local_168,
             (int *)local_148);
  if (local_128[0] == (internal)0x0) {
    testing::Message::Message((Message *)local_168);
    if ((pointer)local_128._8_8_ == (pointer)0x0) {
      pcVar5 = "";
    }
    else {
      pcVar5 = *(char **)local_128._8_8_;
    }
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)local_148,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/p2pderivatives[P]cfd/external/cfd-core/test/test_abstract_transaction.cpp"
               ,0x10a,pcVar5);
    testing::internal::AssertHelper::operator=((AssertHelper *)local_148,(Message *)local_168);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)local_148);
    if ((_func_int **)local_168._0_8_ != (_func_int **)0x0) {
      bVar4 = testing::internal::IsTrue(true);
      if ((bVar4) && ((_func_int **)local_168._0_8_ != (_func_int **)0x0)) {
        (**(code **)(*(_func_int **)local_168._0_8_ + 8))();
      }
      local_168._0_8_ = (_func_int **)0x0;
    }
  }
  testing::internal::
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  reset((scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
         *)(local_128 + 8),(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0)
  ;
  cfd::core::ByteData256::ByteData256((ByteData256 *)&local_d0);
  bVar4 = testing::internal::AlwaysTrue();
  if (bVar4) {
    bVar4 = testing::internal::AlwaysTrue();
    if (bVar4) {
      cfd::core::AbstractTransaction::GetHash
                ((ByteData256 *)local_128,&local_a0.super_AbstractTransaction);
      _Var3._M_p = local_d0._M_dataplus._M_p;
      local_d0._M_dataplus._M_p = (pointer)local_128._0_8_;
      local_d0._M_string_length = local_128._8_8_;
      local_d0.field_2._M_allocated_capacity = local_128._16_8_;
      local_128._0_8_ =
           (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0;
      local_128._8_8_ = (pointer)0x0;
      local_128._16_8_ = (pointer)0x0;
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)_Var3._M_p !=
          (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)0x0) {
        operator_delete(_Var3._M_p);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_128._0_8_ !=
          (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)0x0) {
        operator_delete((void *)local_128._0_8_);
      }
    }
  }
  else {
    testing::Message::Message((Message *)local_128);
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)local_168,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/p2pderivatives[P]cfd/external/cfd-core/test/test_abstract_transaction.cpp"
               ,0x10e,
               "Expected: bytedata = tx.GetHash() doesn\'t throw an exception.\n  Actual: it throws."
              );
    testing::internal::AssertHelper::operator=((AssertHelper *)local_168,(Message *)local_128);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)local_168);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_128._0_8_ !=
        (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)0x0) {
      bVar4 = testing::internal::IsTrue(true);
      if ((bVar4) &&
         ((basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)local_128._0_8_
          != (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0)) {
        (**(code **)(*(size_type *)local_128._0_8_ + 8))();
      }
      local_128._0_8_ =
           (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0;
    }
  }
  cfd::core::ByteData256::GetHex_abi_cxx11_((string *)local_128,(ByteData256 *)&local_d0);
  testing::internal::CmpHelperSTREQ
            ((internal *)local_168,"bytedata.GetHex().c_str()",
             "\"94807f961466e1e236d8192f9a073fb9dea46cad8434c568b55dec0a0f197b0f\"",
             (char *)local_128._0_8_,
             "94807f961466e1e236d8192f9a073fb9dea46cad8434c568b55dec0a0f197b0f");
  sVar2.ptr_ = (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)
               (local_128 + 0x10);
  if ((basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)local_128._0_8_ !=
      sVar2.ptr_) {
    operator_delete((void *)local_128._0_8_);
  }
  if (local_168[0] == (internal)0x0) {
    testing::Message::Message((Message *)local_128);
    if ((pointer)local_168._8_8_ == (pointer)0x0) {
      pcVar5 = "";
    }
    else {
      pcVar5 = *(char **)local_168._8_8_;
    }
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)local_148,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/p2pderivatives[P]cfd/external/cfd-core/test/test_abstract_transaction.cpp"
               ,0x111,pcVar5);
    testing::internal::AssertHelper::operator=((AssertHelper *)local_148,(Message *)local_128);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)local_148);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_128._0_8_ !=
        (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)0x0) {
      bVar4 = testing::internal::IsTrue(true);
      if ((bVar4) &&
         ((basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)local_128._0_8_
          != (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0)) {
        (**(code **)(*(size_type *)local_128._0_8_ + 8))();
      }
      local_128._0_8_ =
           (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0;
    }
  }
  testing::internal::
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  reset((scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
         *)(local_168 + 8),(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0)
  ;
  local_128._0_8_ = sVar2.ptr_;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)local_128,
             "02158a304e6dc2225de38fcd378d6252782085b1f316d6747414ae616d82780763","");
  cfd::core::ByteData::ByteData(&local_60,(string *)local_128);
  if ((basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)local_128._0_8_ !=
      sVar2.ptr_) {
    operator_delete((void *)local_128._0_8_);
  }
  bVar4 = testing::internal::AlwaysTrue();
  if (bVar4) {
    bVar4 = testing::internal::AlwaysTrue();
    if (bVar4) {
      cfd::core::Transaction::AddScriptWitnessStack(&local_48,&local_a0,0,&local_60);
      local_48._vptr_ScriptWitness = (_func_int **)&PTR__ScriptWitness_006940e8;
      std::vector<cfd::core::ByteData,_std::allocator<cfd::core::ByteData>_>::~vector
                (&local_48.witness_stack_);
    }
  }
  else {
    testing::Message::Message((Message *)local_128);
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)local_168,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/p2pderivatives[P]cfd/external/cfd-core/test/test_abstract_transaction.cpp"
               ,0x116,
               "Expected: tx.AddScriptWitnessStack(0, bytedata2) doesn\'t throw an exception.\n  Actual: it throws."
              );
    testing::internal::AssertHelper::operator=((AssertHelper *)local_168,(Message *)local_128);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)local_168);
    if ((basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)local_128._0_8_
        != (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      bVar4 = testing::internal::IsTrue(true);
      if ((bVar4) &&
         ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_128._0_8_ !=
          (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)0x0)) {
        (**(code **)(*(size_type *)local_128._0_8_ + 8))();
      }
      local_128._0_8_ =
           (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0;
    }
  }
  bVar4 = testing::internal::AlwaysTrue();
  if (bVar4) {
    bVar4 = testing::internal::AlwaysTrue();
    if (bVar4) {
      cfd::core::AbstractTransaction::GetWitnessHash
                ((ByteData256 *)local_128,&local_a0.super_AbstractTransaction);
      _Var3._M_p = local_d0._M_dataplus._M_p;
      local_d0._M_dataplus._M_p = (pointer)local_128._0_8_;
      local_d0._M_string_length = local_128._8_8_;
      local_d0.field_2._M_allocated_capacity = local_128._16_8_;
      local_128._0_8_ =
           (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0;
      local_128._8_8_ = (pointer)0x0;
      local_128._16_8_ = (pointer)0x0;
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)_Var3._M_p !=
          (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)0x0) {
        operator_delete(_Var3._M_p);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_128._0_8_ !=
          (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)0x0) {
        operator_delete((void *)local_128._0_8_);
      }
    }
  }
  else {
    testing::Message::Message((Message *)local_128);
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)local_168,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/p2pderivatives[P]cfd/external/cfd-core/test/test_abstract_transaction.cpp"
               ,0x117,
               "Expected: bytedata = tx.GetWitnessHash() doesn\'t throw an exception.\n  Actual: it throws."
              );
    testing::internal::AssertHelper::operator=((AssertHelper *)local_168,(Message *)local_128);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)local_168);
    if ((basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)local_128._0_8_
        != (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      bVar4 = testing::internal::IsTrue(true);
      if ((bVar4) &&
         ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_128._0_8_ !=
          (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)0x0)) {
        (**(code **)(*(size_type *)local_128._0_8_ + 8))();
      }
      local_128._0_8_ =
           (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0;
    }
  }
  cfd::core::ByteData256::GetHex_abi_cxx11_((string *)local_128,(ByteData256 *)&local_d0);
  testing::internal::CmpHelperSTREQ
            ((internal *)local_168,"bytedata.GetHex().c_str()",
             "\"0cc445f41d8b7af9d9f24b60516b1f4ce18d67595b1ca9143678a8df2a7b7416\"",
             (char *)local_128._0_8_,
             "0cc445f41d8b7af9d9f24b60516b1f4ce18d67595b1ca9143678a8df2a7b7416");
  if ((basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)local_128._0_8_ !=
      sVar2.ptr_) {
    operator_delete((void *)local_128._0_8_);
  }
  if (local_168[0] == (internal)0x0) {
    testing::Message::Message((Message *)local_128);
    if ((pointer)local_168._8_8_ == (pointer)0x0) {
      pcVar5 = "";
    }
    else {
      pcVar5 = *(char **)local_168._8_8_;
    }
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)local_148,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/p2pderivatives[P]cfd/external/cfd-core/test/test_abstract_transaction.cpp"
               ,0x11a,pcVar5);
    testing::internal::AssertHelper::operator=((AssertHelper *)local_148,(Message *)local_128);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)local_148);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_128._0_8_ !=
        (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)0x0) {
      bVar4 = testing::internal::IsTrue(true);
      if ((bVar4) &&
         ((basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)local_128._0_8_
          != (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0)) {
        (**(code **)(*(size_type *)local_128._0_8_ + 8))();
      }
      local_128._0_8_ =
           (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0;
    }
  }
  testing::internal::
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  reset((scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
         *)(local_168 + 8),(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0)
  ;
  local_128._8_8_ = (pointer)0x0;
  local_128._16_8_ = local_128._16_8_ & 0xffffffffffffff00;
  local_128._0_8_ = sVar2.ptr_;
  bVar4 = testing::internal::AlwaysTrue();
  if (bVar4) {
    bVar4 = testing::internal::AlwaysTrue();
    if (bVar4) {
      cfd::core::AbstractTransaction::GetHex_abi_cxx11_
                ((string *)local_168,&local_a0.super_AbstractTransaction);
      std::__cxx11::string::operator=((string *)local_128,(string *)local_168);
      if ((_func_int **)local_168._0_8_ != pp_Var1) {
        operator_delete((void *)local_168._0_8_);
      }
    }
  }
  else {
    testing::Message::Message((Message *)local_168);
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)local_148,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/p2pderivatives[P]cfd/external/cfd-core/test/test_abstract_transaction.cpp"
               ,0x11e,
               "Expected: hex = tx.GetHex() doesn\'t throw an exception.\n  Actual: it throws.");
    testing::internal::AssertHelper::operator=((AssertHelper *)local_148,(Message *)local_168);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)local_148);
    if ((_func_int **)local_168._0_8_ != (_func_int **)0x0) {
      bVar4 = testing::internal::IsTrue(true);
      if ((bVar4) && ((_func_int **)local_168._0_8_ != (_func_int **)0x0)) {
        (**(code **)(*(_func_int **)local_168._0_8_ + 8))();
      }
      local_168._0_8_ = (_func_int **)0x0;
    }
  }
  testing::internal::CmpHelperSTREQ
            ((internal *)local_168,"hex.c_str()",
             "\"02000000000101b690010c9f7fea1c2ec617a8513dec56a8bd294e2fb671f67af487671f1ef7e9000000001976a914100358d754597ca2f010f6d84f4a0fe74f71f7bb88acffffffff011027000000000000160014913e0b9281dab16f502101ad4e655074396f34c5012102158a304e6dc2225de38fcd378d6252782085b1f316d6747414ae616d8278076303000000\""
             ,(char *)local_128._0_8_,
             "02000000000101b690010c9f7fea1c2ec617a8513dec56a8bd294e2fb671f67af487671f1ef7e9000000001976a914100358d754597ca2f010f6d84f4a0fe74f71f7bb88acffffffff011027000000000000160014913e0b9281dab16f502101ad4e655074396f34c5012102158a304e6dc2225de38fcd378d6252782085b1f316d6747414ae616d8278076303000000"
            );
  if (local_168[0] == (internal)0x0) {
    testing::Message::Message((Message *)local_148);
    if ((pointer)local_168._8_8_ == (pointer)0x0) {
      pcVar5 = "";
    }
    else {
      pcVar5 = *(char **)local_168._8_8_;
    }
    testing::internal::AssertHelper::AssertHelper
              (&local_e8,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/p2pderivatives[P]cfd/external/cfd-core/test/test_abstract_transaction.cpp"
               ,0x121,pcVar5);
    testing::internal::AssertHelper::operator=(&local_e8,(Message *)local_148);
    testing::internal::AssertHelper::~AssertHelper(&local_e8);
    if ((undefined **)local_148._0_8_ != (undefined **)0x0) {
      bVar4 = testing::internal::IsTrue(true);
      if ((bVar4) && ((undefined **)local_148._0_8_ != (undefined **)0x0)) {
        (**(code **)(*(undefined **)local_148._0_8_ + 8))();
      }
      local_148._0_8_ = (undefined **)0x0;
    }
  }
  testing::internal::
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  reset((scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
         *)(local_168 + 8),(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0)
  ;
  cfd::core::Txid::Txid((Txid *)local_168);
  bVar4 = testing::internal::AlwaysTrue();
  if (bVar4) {
    bVar4 = testing::internal::AlwaysTrue();
    if (bVar4) {
      cfd::core::AbstractTransaction::GetTxid((Txid *)local_148,&local_a0.super_AbstractTransaction)
      ;
      cfd::core::Txid::operator=((Txid *)local_168,(Txid *)local_148);
      local_148._0_8_ = &PTR__Txid_0068dcd8;
      if ((void *)CONCAT71(local_148._9_7_,local_148[8]) != (void *)0x0) {
        operator_delete((void *)CONCAT71(local_148._9_7_,local_148[8]));
      }
    }
  }
  else {
    testing::Message::Message((Message *)local_148);
    testing::internal::AssertHelper::AssertHelper
              (&local_e8,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/p2pderivatives[P]cfd/external/cfd-core/test/test_abstract_transaction.cpp"
               ,0x125,
               "Expected: txid = tx.GetTxid() doesn\'t throw an exception.\n  Actual: it throws.");
    testing::internal::AssertHelper::operator=(&local_e8,(Message *)local_148);
    testing::internal::AssertHelper::~AssertHelper(&local_e8);
    if ((undefined **)local_148._0_8_ != (undefined **)0x0) {
      bVar4 = testing::internal::IsTrue(true);
      if ((bVar4) && ((undefined **)local_148._0_8_ != (undefined **)0x0)) {
        (**(code **)(*(undefined **)local_148._0_8_ + 8))();
      }
      local_148._0_8_ = (undefined **)0x0;
    }
  }
  cfd::core::Txid::GetHex_abi_cxx11_((string *)local_148,(Txid *)local_168);
  testing::internal::CmpHelperSTREQ
            ((internal *)&local_e8,"txid.GetHex().c_str()",
             "\"0f7b190f0aec5db568c53484ad6ca4deb93f079a2f19d836e2e16614967f8094\"",
             (char *)local_148._0_8_,
             "0f7b190f0aec5db568c53484ad6ca4deb93f079a2f19d836e2e16614967f8094");
  if ((undefined **)local_148._0_8_ != local_138) {
    operator_delete((void *)local_148._0_8_);
  }
  if (local_e8.data_._0_1_ == (internal)0x0) {
    testing::Message::Message((Message *)local_148);
    if (local_e0.ptr_ == (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      pcVar5 = "";
    }
    else {
      pcVar5 = ((local_e0.ptr_)->_M_dataplus)._M_p;
    }
    testing::internal::AssertHelper::AssertHelper
              (&local_d8,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/p2pderivatives[P]cfd/external/cfd-core/test/test_abstract_transaction.cpp"
               ,0x128,pcVar5);
    testing::internal::AssertHelper::operator=(&local_d8,(Message *)local_148);
    testing::internal::AssertHelper::~AssertHelper(&local_d8);
    if ((undefined **)local_148._0_8_ != (undefined **)0x0) {
      bVar4 = testing::internal::IsTrue(true);
      if ((bVar4) && ((undefined **)local_148._0_8_ != (undefined **)0x0)) {
        (**(code **)(*(undefined **)local_148._0_8_ + 8))();
      }
      local_148._0_8_ = (undefined **)0x0;
    }
  }
  testing::internal::
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  reset(&local_e0,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0);
  local_168._0_8_ = &PTR__Txid_0068dcd8;
  if ((pointer)local_168._8_8_ != (pointer)0x0) {
    operator_delete((void *)local_168._8_8_);
  }
  if ((basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)local_128._0_8_ !=
      sVar2.ptr_) {
    operator_delete((void *)local_128._0_8_);
  }
  if (local_60.data_.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
      super__Vector_impl_data._M_start != (pointer)0x0) {
    operator_delete(local_60.data_.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>
                    ._M_impl.super__Vector_impl_data._M_start);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_d0._M_dataplus._M_p !=
      (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)0x0) {
    operator_delete(local_d0._M_dataplus._M_p);
  }
  cfd::core::Transaction::~Transaction(&local_a0);
  return;
}

Assistant:

TEST(AbstractTransaction, GetValueOut) {
  int32_t version = 2;
  uint32_t locktime = 3;
  uint32_t vout = 0;
  uint32_t seq = 0xffffffff;

  Transaction tx(version, locktime);
  tx.AddTxIn(
      Txid("e9f71e1f6787f47af671b62f4e29bda856ec3d51a817c62e1cea7f9f0c0190b6"),
      vout, seq, Script("76a914100358d754597ca2f010f6d84f4a0fe74f71f7bb88ac"));
  tx.AddTxOut(Amount::CreateBySatoshiAmount(10000),
              Script("0014913e0b9281dab16f502101ad4e655074396f34c5"));
  Amount amount;
  // GetValueOut
  EXPECT_NO_THROW(amount = tx.GetValueOut());
  EXPECT_EQ(amount.GetSatoshiValue(), 10000);

  // GetHash(bool)
  ByteData256 bytedata;
  EXPECT_NO_THROW(bytedata = tx.GetHash());
  EXPECT_STREQ(
      bytedata.GetHex().c_str(),
      "94807f961466e1e236d8192f9a073fb9dea46cad8434c568b55dec0a0f197b0f");

  // GetWitnessHash
  ByteData bytedata2(
      "02158a304e6dc2225de38fcd378d6252782085b1f316d6747414ae616d82780763");
  EXPECT_NO_THROW(tx.AddScriptWitnessStack(0, bytedata2));
  EXPECT_NO_THROW(bytedata = tx.GetWitnessHash());
  EXPECT_STREQ(
      bytedata.GetHex().c_str(),
      "0cc445f41d8b7af9d9f24b60516b1f4ce18d67595b1ca9143678a8df2a7b7416");

  // GetHex
  std::string hex;
  EXPECT_NO_THROW(hex = tx.GetHex());
  EXPECT_STREQ(
      hex.c_str(),
      "02000000000101b690010c9f7fea1c2ec617a8513dec56a8bd294e2fb671f67af487671f1ef7e9000000001976a914100358d754597ca2f010f6d84f4a0fe74f71f7bb88acffffffff011027000000000000160014913e0b9281dab16f502101ad4e655074396f34c5012102158a304e6dc2225de38fcd378d6252782085b1f316d6747414ae616d8278076303000000");

  // GetTxid
  Txid txid;
  EXPECT_NO_THROW(txid = tx.GetTxid());
  EXPECT_STREQ(
      txid.GetHex().c_str(),
      "0f7b190f0aec5db568c53484ad6ca4deb93f079a2f19d836e2e16614967f8094");
}